

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::InputFile::rawPixelDataToBuffer
          (InputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  ArgExc *pAVar1;
  int *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  ScanLineInputFile *unaff_retaddr;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x78) != 0) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read a raw scanline from a deep image.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((*(byte *)(*(long *)(in_RDI + 8) + 100) & 1) != 0) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read a raw scanline from a tiled image.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  ScanLineInputFile::rawPixelDataToBuffer
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
             (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return;
}

Assistant:

void
InputFile::rawPixelDataToBuffer (int scanLine,
                                 char *pixelData,
                                 int &pixelDataSize) const
{
    try
    {
        if (_data->dsFile)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
                                         "from a deep image.");
        }
        
        else if (_data->isTiled)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
                                         "from a tiled image.");
        }
        
        _data->sFile->rawPixelDataToBuffer(scanLine, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}